

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_cobs.c
# Opt level: O0

int mpt_decode_cobs_r(mpt_decode_state *dec,iovec *source,size_t sourcelen)

{
  size_t sVar1;
  size_t len;
  mpt_message tmp;
  int ret;
  size_t sourcelen_local;
  iovec *source_local;
  mpt_decode_state *dec_local;
  
  tmp.clen._4_4_ = mpt_decode_cobs(dec,source,sourcelen);
  dec_local._4_4_ = tmp.clen._4_4_;
  if ((tmp.clen._4_4_ == -0x10) && (dec->_ctx != 0)) {
    tmp.used = 0;
    len = 0;
    tmp.base = source;
    tmp.cont = (iovec *)sourcelen;
    mpt_message_read((mpt_message *)&len,(dec->data).pos + (dec->data).len,(void *)0x0);
    if (len == 0) {
      dec_local._4_4_ = -0x11;
    }
    else {
      *(char *)tmp.used = (char)dec->_ctx;
      sVar1 = (dec->data).len + 1;
      (dec->data).len = sVar1;
      (dec->data).msg = sVar1;
      dec->_ctx = 0;
      dec->curr = dec->curr + 1;
      dec_local._4_4_ = 1;
    }
  }
  return dec_local._4_4_;
}

Assistant:

static int _decode_r
#endif
(MPT_STRUCT(decode_state) *dec, const struct iovec *source, size_t sourcelen)
{
	int ret = MPT_cobs_dec_regular(dec, source, sourcelen);
	
	/* inline zero byte */
	if (ret == MPT_ERROR(MissingData)
	    && dec->_ctx) {
		MPT_STRUCT(message) tmp;
		size_t len;
		
		len = dec->data.pos + dec->data.len;
		
		tmp.base = 0;
		tmp.used = 0;
		tmp.cont = (void *) source;
		tmp.clen = sourcelen;
		mpt_message_read(&tmp, len, 0);
		
		if (!tmp.used) {
			return MPT_ERROR(MissingBuffer);
		}
		/* add inlined end byte */
		*((uint8_t *) tmp.base) = (dec->_ctx & 0xff);
		dec->data.msg = ++dec->data.len;
		
		dec->_ctx = 0;
		++dec->curr;
		return 1;
	}
	return ret;
}